

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O3

void Direct_Move_Y(TT_ExecContext exc,TT_GlyphZone zone,FT_UShort point,FT_F26Dot6 distance)

{
  FT_Pos *pFVar1;
  
  if ((((*(int *)&(exc->face->root).driver[2].root.library != 0x28) ||
       (exc->backward_compatibility == '\0')) || (exc->iupx_called == '\0')) ||
     (exc->iupy_called == '\0')) {
    pFVar1 = &zone->cur[point].y;
    *pFVar1 = *pFVar1 + distance;
  }
  zone->tags[point] = zone->tags[point] | 0x10;
  return;
}

Assistant:

static void
  Direct_Move_Y( TT_ExecContext  exc,
                 TT_GlyphZone    zone,
                 FT_UShort       point,
                 FT_F26Dot6      distance )
  {
    FT_UNUSED( exc );

#ifdef TT_SUPPORT_SUBPIXEL_HINTING_MINIMAL
    if ( !( SUBPIXEL_HINTING_MINIMAL             &&
            exc->backward_compatibility          &&
            exc->iupx_called && exc->iupy_called ) )
#endif
      zone->cur[point].y = ADD_LONG( zone->cur[point].y, distance );

    zone->tags[point] |= FT_CURVE_TAG_TOUCH_Y;
  }